

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddChrpathPatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  bool bVar1;
  __type _Var2;
  PolicyStatus PVar3;
  cmComputeLinkInformation *this_00;
  cmMakefile *this_01;
  string *psVar4;
  ostream *poVar5;
  cmGlobalGenerator *pcVar6;
  iterator iVar7;
  pointer pbVar8;
  char *pcVar9;
  pointer pbVar10;
  string *i;
  int darwin_major_version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newRuntimeDirs;
  string installNameTool;
  string runpath;
  string darwin_major_version_s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oldRuntimeDirs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runpaths;
  istringstream ss;
  byte abStack_190 [352];
  
  if (this->ImportLibrary != false) {
    return;
  }
  bVar1 = cmGeneratorTarget::IsChrpathUsed(this->Target,config);
  if (!bVar1) {
    return;
  }
  this_00 = cmGeneratorTarget::GetLinkInformation(this->Target,config);
  if (this_00 == (cmComputeLinkInformation *)0x0) {
    return;
  }
  this_01 = cmTarget::GetMakefile(this->Target->Target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator<char> *)&runpaths);
  bVar1 = cmMakefile::IsOn(this_01,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"CMAKE_INSTALL_NAME_TOOL",(allocator<char> *)&runpaths);
    psVar4 = cmMakefile::GetSafeDefinition(this_01,(string *)&ss);
    std::__cxx11::string::string((string *)&installNameTool,(string *)psVar4);
    std::__cxx11::string::~string((string *)&ss);
    oldRuntimeDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    oldRuntimeDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    oldRuntimeDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    newRuntimeDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newRuntimeDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    newRuntimeDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmComputeLinkInformation::GetRPath(this_00,&oldRuntimeDirs,false);
    cmComputeLinkInformation::GetRPath(this_00,&newRuntimeDirs,true);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"DARWIN_MAJOR_VERSION",(allocator<char> *)&runpaths);
    psVar4 = cmMakefile::GetSafeDefinition(this_01,(string *)&ss);
    std::__cxx11::string::string((string *)&darwin_major_version_s,(string *)psVar4);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&ss,(string *)&darwin_major_version_s,_S_in);
    std::istream::operator>>(&ss,&darwin_major_version);
    pbVar10 = oldRuntimeDirs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((((abStack_190[*(long *)(_ss + -0x18)] & 5) == 0) && (darwin_major_version < 10)) &&
       ((oldRuntimeDirs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         oldRuntimeDirs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish ||
        (pbVar10 = oldRuntimeDirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
        newRuntimeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        newRuntimeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&runpaths);
      poVar5 = std::operator<<((ostream *)&runpaths,"WARNING: Target \"");
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      poVar5 = std::operator<<(poVar5,(string *)psVar4);
      poVar5 = std::operator<<(poVar5,
                               "\" has runtime paths which cannot be changed during install.  ");
      poVar5 = std::operator<<(poVar5,
                               "To change runtime paths, OS X version 10.6 or newer is required.  ")
      ;
      poVar5 = std::operator<<(poVar5,
                               "Therefore, runtime paths will not be changed when installing.  ");
      std::operator<<(poVar5,
                      "CMAKE_BUILD_WITH_INSTALL_RPATH may be used to work around this limitation.");
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_01,WARNING,&runpath);
      std::__cxx11::string::~string((string *)&runpath);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&runpaths);
    }
    else {
      runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &runpaths._M_t._M_impl.super__Rb_tree_header._M_header;
      runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      runpaths._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (pbVar8 = oldRuntimeDirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar10;
          pbVar8 = pbVar8 + 1) {
        pcVar6 = cmMakefile::GetGlobalGenerator(this_01);
        (*pcVar6->_vptr_cmGlobalGenerator[0x14])(&runpath,pcVar6,pbVar8,config);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&runpaths._M_t,&runpath);
        if ((_Rb_tree_header *)iVar7._M_node == &runpaths._M_t._M_impl.super__Rb_tree_header) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&runpaths,&runpath);
          poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
          poVar5 = std::operator<<(poVar5,"execute_process(COMMAND ");
          poVar5 = std::operator<<(poVar5,(string *)&installNameTool);
          std::operator<<(poVar5,"\n");
          poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
          poVar5 = std::operator<<(poVar5,"  -delete_rpath \"");
          poVar5 = std::operator<<(poVar5,(string *)&runpath);
          std::operator<<(poVar5,"\"\n");
          poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
          poVar5 = std::operator<<(poVar5,"  \"");
          poVar5 = std::operator<<(poVar5,(string *)toDestDirPath);
          std::operator<<(poVar5,"\")\n");
        }
        std::__cxx11::string::~string((string *)&runpath);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&runpaths._M_t);
      pbVar10 = newRuntimeDirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = newRuntimeDirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar10;
          pbVar8 = pbVar8 + 1) {
        pcVar6 = cmMakefile::GetGlobalGenerator(this_01);
        (*pcVar6->_vptr_cmGlobalGenerator[0x14])(&runpath,pcVar6,pbVar8,config);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&runpaths._M_t,&runpath);
        if ((_Rb_tree_header *)iVar7._M_node == &runpaths._M_t._M_impl.super__Rb_tree_header) {
          poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
          poVar5 = std::operator<<(poVar5,"execute_process(COMMAND ");
          poVar5 = std::operator<<(poVar5,(string *)&installNameTool);
          std::operator<<(poVar5,"\n");
          poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
          poVar5 = std::operator<<(poVar5,"  -add_rpath \"");
          poVar5 = std::operator<<(poVar5,(string *)&runpath);
          std::operator<<(poVar5,"\"\n");
          poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
          poVar5 = std::operator<<(poVar5,"  \"");
          poVar5 = std::operator<<(poVar5,(string *)toDestDirPath);
          std::operator<<(poVar5,"\")\n");
        }
        std::__cxx11::string::~string((string *)&runpath);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&runpaths._M_t);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    std::__cxx11::string::~string((string *)&darwin_major_version_s);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&newRuntimeDirs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&oldRuntimeDirs);
    psVar4 = &installNameTool;
    goto LAB_002d8993;
  }
  cmComputeLinkInformation::GetRPathString_abi_cxx11_((string *)&ss,this_00,false);
  cmComputeLinkInformation::GetChrpathString_abi_cxx11_((string *)&runpaths,this_00);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &runpaths);
  if (!_Var2) {
    cmOutputConverter::EscapeForCMake(&installNameTool,(string *)&ss);
    cmOutputConverter::EscapeForCMake(&darwin_major_version_s,(string *)&runpaths);
    poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar5 = std::operator<<(poVar5,"file(RPATH_CHANGE\n");
    poVar5 = operator<<(poVar5,(cmScriptGeneratorIndent)indent.Level);
    poVar5 = std::operator<<(poVar5,"     FILE \"");
    poVar5 = std::operator<<(poVar5,(string *)toDestDirPath);
    poVar5 = std::operator<<(poVar5,"\"\n");
    poVar5 = operator<<(poVar5,(cmScriptGeneratorIndent)indent.Level);
    poVar5 = std::operator<<(poVar5,"     OLD_RPATH ");
    poVar5 = std::operator<<(poVar5,(string *)&installNameTool);
    std::operator<<(poVar5,"\n");
    PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0095(this->Target);
    if (PVar3 == OLD) {
LAB_002d8677:
      poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      poVar5 = std::operator<<(poVar5,"     NEW_RPATH \"");
      poVar5 = std::operator<<(poVar5,(string *)&runpaths);
      pcVar9 = "\")\n";
    }
    else {
      if (PVar3 == WARN) {
        IssueCMP0095Warning(this,(string *)&runpaths);
        goto LAB_002d8677;
      }
      poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      poVar5 = std::operator<<(poVar5,"     NEW_RPATH ");
      poVar5 = std::operator<<(poVar5,(string *)&darwin_major_version_s);
      pcVar9 = ")\n";
    }
    std::operator<<(poVar5,pcVar9);
    std::__cxx11::string::~string((string *)&darwin_major_version_s);
    std::__cxx11::string::~string((string *)&installNameTool);
  }
  std::__cxx11::string::~string((string *)&runpaths);
  psVar4 = (string *)&ss;
LAB_002d8993:
  std::__cxx11::string::~string((string *)psVar4);
  return;
}

Assistant:

void cmInstallTargetGenerator::AddChrpathPatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  // Skip the chrpath if the target does not need it.
  if (this->ImportLibrary || !this->Target->IsChrpathUsed(config)) {
    return;
  }

  // Get the link information for this target.
  // It can provide the RPATH.
  cmComputeLinkInformation* cli = this->Target->GetLinkInformation(config);
  if (!cli) {
    return;
  }

  cmMakefile* mf = this->Target->Target->GetMakefile();

  if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    // If using install_name_tool, set up the rules to modify the rpaths.
    std::string installNameTool =
      mf->GetSafeDefinition("CMAKE_INSTALL_NAME_TOOL");

    std::vector<std::string> oldRuntimeDirs, newRuntimeDirs;
    cli->GetRPath(oldRuntimeDirs, false);
    cli->GetRPath(newRuntimeDirs, true);

    std::string darwin_major_version_s =
      mf->GetSafeDefinition("DARWIN_MAJOR_VERSION");

    std::istringstream ss(darwin_major_version_s);
    int darwin_major_version;
    ss >> darwin_major_version;
    if (!ss.fail() && darwin_major_version <= 9 &&
        (!oldRuntimeDirs.empty() || !newRuntimeDirs.empty())) {
      std::ostringstream msg;
      msg
        << "WARNING: Target \"" << this->Target->GetName()
        << "\" has runtime paths which cannot be changed during install.  "
        << "To change runtime paths, OS X version 10.6 or newer is required.  "
        << "Therefore, runtime paths will not be changed when installing.  "
        << "CMAKE_BUILD_WITH_INSTALL_RPATH may be used to work around"
           " this limitation.";
      mf->IssueMessage(MessageType::WARNING, msg.str());
    } else {
      // Note: These paths are kept unique to avoid
      // install_name_tool corruption.
      std::set<std::string> runpaths;
      for (std::string const& i : oldRuntimeDirs) {
        std::string runpath =
          mf->GetGlobalGenerator()->ExpandCFGIntDir(i, config);

        if (runpaths.find(runpath) == runpaths.end()) {
          runpaths.insert(runpath);
          os << indent << "execute_process(COMMAND " << installNameTool
             << "\n";
          os << indent << "  -delete_rpath \"" << runpath << "\"\n";
          os << indent << "  \"" << toDestDirPath << "\")\n";
        }
      }

      runpaths.clear();
      for (std::string const& i : newRuntimeDirs) {
        std::string runpath =
          mf->GetGlobalGenerator()->ExpandCFGIntDir(i, config);

        if (runpaths.find(runpath) == runpaths.end()) {
          os << indent << "execute_process(COMMAND " << installNameTool
             << "\n";
          os << indent << "  -add_rpath \"" << runpath << "\"\n";
          os << indent << "  \"" << toDestDirPath << "\")\n";
        }
      }
    }
  } else {
    // Construct the original rpath string to be replaced.
    std::string oldRpath = cli->GetRPathString(false);

    // Get the install RPATH from the link information.
    std::string newRpath = cli->GetChrpathString();

    // Skip the rule if the paths are identical
    if (oldRpath == newRpath) {
      return;
    }

    // Escape any CMake syntax in the RPATHs.
    std::string escapedOldRpath = cmOutputConverter::EscapeForCMake(oldRpath);
    std::string escapedNewRpath = cmOutputConverter::EscapeForCMake(newRpath);

    // Write a rule to run chrpath to set the install-tree RPATH
    os << indent << "file(RPATH_CHANGE\n"
       << indent << "     FILE \"" << toDestDirPath << "\"\n"
       << indent << "     OLD_RPATH " << escapedOldRpath << "\n";

    // CMP0095: ``RPATH`` entries are properly escaped in the intermediary
    // CMake install script.
    switch (this->Target->GetPolicyStatusCMP0095()) {
      case cmPolicies::WARN:
        this->IssueCMP0095Warning(newRpath);
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        os << indent << "     NEW_RPATH \"" << newRpath << "\")\n";
        break;
      default:
        os << indent << "     NEW_RPATH " << escapedNewRpath << ")\n";
        break;
    }
  }
}